

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

Roaring64Map *
roaring::Roaring64Map::readSafe(Roaring64Map *__return_storage_ptr__,char *buf,size_t maxbytes)

{
  _Rb_tree_header *p_Var1;
  uint32_t key;
  size_t sVar2;
  runtime_error *prVar3;
  long lVar4;
  ulong uVar5;
  uint32_t *puVar6;
  bool bVar7;
  Roaring read_var;
  
  if (maxbytes < 8) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"ran out of bytes");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var1 = &(__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(__return_storage_ptr__->roarings)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header =
       0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->copyOnWrite = false;
  lVar4 = *(long *)buf;
  puVar6 = (uint32_t *)(buf + 8);
  uVar5 = maxbytes - 8;
  while( true ) {
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar7) {
      return __return_storage_ptr__;
    }
    if (uVar5 < 4) break;
    key = *puVar6;
    Roaring::readSafe(&read_var,(char *)(puVar6 + 1),uVar5 - 4);
    sVar2 = Roaring::getSizeInBytes(&read_var,true);
    emplaceOrInsert(__return_storage_ptr__,key,&read_var);
    uVar5 = (uVar5 - 4) - sVar2;
    puVar6 = (uint32_t *)((long)(puVar6 + 1) + sVar2);
    Roaring::~Roaring(&read_var);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"ran out of bytes");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Roaring64Map readSafe(const char *buf, size_t maxbytes) {
        if (maxbytes < sizeof(uint64_t)) {
            ROARING_TERMINATE("ran out of bytes");
        }
        Roaring64Map result;
        uint64_t map_size;
        std::memcpy(&map_size, buf, sizeof(uint64_t));
        buf += sizeof(uint64_t);
        maxbytes -= sizeof(uint64_t);
        for (uint64_t lcv = 0; lcv < map_size; lcv++) {
            if (maxbytes < sizeof(uint32_t)) {
                ROARING_TERMINATE("ran out of bytes");
            }
            uint32_t key;
            std::memcpy(&key, buf, sizeof(uint32_t));
            // ^-- Note: `uint32_t key = *((uint32_t*)buf);` is undefined

            buf += sizeof(uint32_t);
            maxbytes -= sizeof(uint32_t);
            // read map value Roaring
            Roaring read_var = Roaring::readSafe(buf, maxbytes);
            // forward buffer past the last Roaring Bitmap
            size_t tz = read_var.getSizeInBytes(true);
            buf += tz;
            maxbytes -= tz;
            result.emplaceOrInsert(key, std::move(read_var));
        }
        return result;
    }